

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_http_client_async_blocking.cpp
# Opt level: O0

bool __thiscall Client::ReadResponse(Client *this)

{
  bool bVar1;
  ostream *poVar2;
  error_code local_78 [2];
  error_code local_58;
  anon_class_16_2_e8808019_for_handler_ local_48;
  mutable_buffer local_38;
  undefined1 local_28 [8];
  error_code ec;
  Client *this_local;
  
  ec.cat_ = (error_category *)this;
  boost::system::error_code::error_code<boost::asio::error::basic_errors>
            ((error_code *)local_28,try_again,(type *)0x0);
  local_38 = boost::asio::buffer<char,std::allocator<char>>(&this->buffer_);
  local_48.ec = (error_code *)local_28;
  local_48.this = this;
  boost::asio::ssl::
  stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
  ::async_read_some<boost::asio::mutable_buffer,Client::ReadResponse()::__0>
            ((stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
              *)&this->ssl_socket_,&local_38,&local_48);
  do {
    boost::asio::io_context::run_one(&this->io_context_);
    boost::system::error_code::error_code<boost::asio::error::basic_errors>
              (&local_58,try_again,(type *)0x0);
    bVar1 = boost::system::operator==((error_code *)local_28,&local_58);
  } while (bVar1);
  bVar1 = boost::system::error_code::operator_cast_to_bool((error_code *)local_28);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Read failed: ");
    boost::system::error_code::message_abi_cxx11_(local_78);
    poVar2 = std::operator<<(poVar2,(string *)local_78);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)local_78);
  }
  this_local._7_1_ = !bVar1;
  return this_local._7_1_;
}

Assistant:

bool Client::ReadResponse() {
  boost::system::error_code ec = boost::asio::error::would_block;

  ssl_socket_.async_read_some(
      boost::asio::buffer(buffer_),
      [this, &ec](boost::system::error_code inner_ec, std::size_t length) {
        ec = inner_ec;

        if (inner_ec || length == 0) {
          std::cout << "Socket read error." << std::endl;
          return;
        }

        std::cout.write(buffer_.data(), length);

        // TODO: Call ReadResponse() to read until the end.
      });

  // Block until the asynchronous operation has completed.
  do {
    io_context_.run_one();
  } while (ec == boost::asio::error::would_block);

  if (ec) {
    std::cout << "Read failed: " << ec.message() << std::endl;
    return false;
  }

  return true;
}